

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_swap(mcu8str *str1,mcu8str *str2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  mcu8str tmp;
  mcu8str *str2_local;
  mcu8str *str1_local;
  
  pcVar4 = str1->c_str;
  uVar1 = str1->size;
  uVar2 = str1->buflen;
  iVar3 = str1->owns_memory;
  str1->c_str = str2->c_str;
  str1->size = str2->size;
  str1->buflen = str2->buflen;
  str1->owns_memory = str2->owns_memory;
  str2->c_str = pcVar4;
  str2->size = uVar1;
  str2->buflen = uVar2;
  str2->owns_memory = iVar3;
  return;
}

Assistant:

void mcu8str_swap( mcu8str* str1, mcu8str* str2 )
  {
    mcu8str tmp;
    tmp.c_str = str1->c_str;
    tmp.size = str1->size;
    tmp.buflen = str1->buflen;
    tmp.owns_memory = str1->owns_memory;
    str1->c_str = str2->c_str;
    str1->size = str2->size;
    str1->buflen = str2->buflen;
    str1->owns_memory = str2->owns_memory;
    str2->c_str = tmp.c_str;
    str2->size = tmp.size;
    str2->buflen = tmp.buflen;
    str2->owns_memory = tmp.owns_memory;
  }